

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_address_set_host_ip(ENetAddress *address,char *name)

{
  int iVar1;
  
  iVar1 = inet_pton(2,name,address);
  return -(uint)(iVar1 == 0);
}

Assistant:

int
enet_address_set_host_ip (ENetAddress * address, const char * name)
{
#ifdef HAS_INET_PTON
    if (! inet_pton (AF_INET, name, & address -> host))
#else
    if (! inet_aton (name, (struct in_addr *) & address -> host))
#endif
        return -1;

    return 0;
}